

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Release(int g_a,int *lo,int *hi)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  Integer in_stack_00000140;
  int local_b0;
  int local_ac;
  Integer local_a8 [8];
  Integer local_68 [8];
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = (long)in_EDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = pnga_ndim(in_stack_00000140);
  for (local_ac = 0; local_ac < local_28; local_ac = local_ac + 1) {
    local_68[(local_28 - local_ac) + -1] = (long)*(int *)(local_10 + (long)local_ac * 4) + 1;
  }
  for (local_b0 = 0; local_b0 < local_28; local_b0 = local_b0 + 1) {
    local_a8[(local_28 - local_b0) + -1] = (long)*(int *)(local_18 + (long)local_b0 * 4) + 1;
  }
  pnga_release(local_20,local_68,local_a8);
  return;
}

Assistant:

void NGA_Release(int g_a, int lo[], int hi[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);

     wnga_release(a,_ga_lo, _ga_hi);
}